

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int wally_psbt_add_output_at(wally_psbt *psbt,uint32_t index,uint32_t flags,wally_tx_output *output)

{
  wally_tx *tx;
  int iVar1;
  ulong num_items;
  ulong index_00;
  
  iVar1 = -2;
  if ((((psbt != (wally_psbt *)0x0) && (tx = psbt->tx, tx != (wally_tx *)0x0)) && (flags == 0)) &&
     (((tx->num_outputs == psbt->num_outputs &&
       (index_00 = (ulong)index, output != (wally_tx_output *)0x0 && index_00 <= tx->num_outputs))
      && (iVar1 = wally_tx_add_output_at(tx,index,output), iVar1 == 0)))) {
    num_items = psbt->num_outputs;
    if (psbt->outputs_allocation_len <= num_items) {
      iVar1 = array_grow(&psbt->outputs,num_items,&psbt->outputs_allocation_len,0xd0);
      if (iVar1 != 0) {
        wally_tx_remove_output(psbt->tx,index_00);
        return iVar1;
      }
      num_items = psbt->num_outputs;
    }
    memmove(psbt->outputs + index_00 + 1,psbt->outputs + index_00,(num_items - index_00) * 0xd0);
    wally_clear(psbt->outputs + index_00,0xd0);
    psbt->num_outputs = psbt->num_outputs + 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int wally_psbt_add_output_at(struct wally_psbt *psbt,
                             uint32_t index, uint32_t flags,
                             const struct wally_tx_output *output)
{
    int ret;

    if (!psbt || !psbt->tx || psbt->tx->num_outputs != psbt->num_outputs ||
        flags || index > psbt->num_outputs || !output)
        return WALLY_EINVAL;

    ret = wally_tx_add_output_at(psbt->tx, index, output);

    if (ret == WALLY_OK) {
        if (psbt->num_outputs >= psbt->outputs_allocation_len) {
            ret = array_grow((void *)&psbt->outputs, psbt->num_outputs,
                             &psbt->outputs_allocation_len,
                             sizeof(struct wally_psbt_output));
            if (ret != WALLY_OK) {
                wally_tx_remove_output(psbt->tx, index);
                return ret;
            }
        }

        memmove(psbt->outputs + index + 1, psbt->outputs + index,
                (psbt->num_outputs - index) * sizeof(struct wally_psbt_output));
        wally_clear(psbt->outputs + index, sizeof(struct wally_psbt_output));
        psbt->num_outputs += 1;
    }
    return ret;
}